

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O2

void ncnn::im2col_sgemm_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  uint uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  int iVar27;
  undefined1 *puVar28;
  void *pvVar29;
  size_t sVar30;
  ulong uVar31;
  long lVar32;
  undefined4 *puVar33;
  undefined1 *puVar34;
  undefined4 *puVar35;
  long lVar36;
  undefined4 *puVar37;
  int *piVar38;
  long lVar39;
  ulong *puVar40;
  long lVar41;
  undefined4 *puVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 local_b8 [16];
  undefined1 local_88 [64];
  size_t local_48;
  void *local_38;
  
  iVar13 = cpu_support_x86_avx2();
  if (iVar13 != 0) {
    im2col_sgemm_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar13 = cpu_support_x86_xop();
  if (iVar13 == 0) {
    uVar2 = bottom_im2col->w;
    iVar13 = bottom_im2col->h;
    uVar19 = bottom_im2col->c;
    lVar36 = (long)(int)uVar19;
    iVar3 = top_blob->c;
    local_48 = 0;
    local_88._0_8_ = (void *)0x0;
    local_88._8_4_ = 0;
    local_88._12_4_ = 0;
    local_88._16_8_ = 0;
    local_88._24_4_ = 0;
    local_88._32_8_ = (Allocator *)0x0;
    local_88._40_4_ = 0;
    local_88._44_4_ = 0;
    local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
    iVar20 = iVar13;
    uVar18 = uVar2;
    if (lVar36 < 4) {
      sVar30 = 1;
      iVar27 = 1;
      uVar22 = uVar19;
      if (1 < (int)uVar2) {
        iVar20 = iVar13 * 2;
        uVar18 = (uVar2 & 1) + (uVar2 >> 1);
      }
    }
    else {
      sVar30 = 4;
      if ((int)uVar2 < 2) {
        uVar22 = (uVar19 & 3) + (uVar19 >> 2);
      }
      else {
        uVar22 = (uVar19 & 3) + (uVar19 >> 2);
        iVar20 = iVar13 * 2;
        uVar18 = (uVar2 & 1) + (uVar2 >> 1);
      }
      iVar27 = 4;
    }
    Mat::create((Mat *)local_88,iVar20,uVar22,uVar18,sVar30,iVar27,opt->workspace_allocator);
    uVar21 = 0;
    iVar20 = 0;
    if (0 < iVar13) {
      iVar20 = iVar13;
    }
    uVar31 = (ulong)(int)uVar2;
    uVar24 = (ulong)(uint)((int)uVar2 >> 1);
    if ((int)uVar2 >> 1 < 1) {
      uVar24 = uVar21;
    }
    for (uVar16 = 0; uVar16 != uVar24; uVar16 = uVar16 + 1) {
      puVar34 = (undefined1 *)(local_48 * uVar16 * local_88._16_8_ + local_88._0_8_);
      lVar41 = 1;
      lVar39 = 2;
      lVar23 = 3;
      for (uVar25 = 0; (long)(uVar25 | 3) < lVar36; uVar25 = uVar25 + 4) {
        lVar14 = bottom_im2col->cstep * bottom_im2col->elemsize;
        lVar32 = (long)bottom_im2col->data + uVar21;
        iVar27 = iVar20;
        while (bVar43 = iVar27 != 0, iVar27 = iVar27 + -1, bVar43) {
          *puVar34 = *(undefined1 *)(lVar32 + lVar14 * uVar25);
          puVar34[1] = *(undefined1 *)(lVar32 + lVar14 * lVar41);
          puVar34[2] = *(undefined1 *)(lVar32 + lVar14 * lVar39);
          puVar34[3] = *(undefined1 *)(lVar32 + lVar14 * lVar23);
          puVar34[4] = *(undefined1 *)(lVar32 + 1 + lVar14 * uVar25);
          puVar34[5] = *(undefined1 *)(lVar32 + 1 + lVar14 * lVar41);
          puVar34[6] = *(undefined1 *)(lVar32 + 1 + lVar14 * lVar39);
          puVar34[7] = *(undefined1 *)(lVar32 + 1 + lVar14 * lVar23);
          puVar34 = puVar34 + 8;
          lVar32 = lVar32 + uVar31;
        }
        lVar23 = lVar23 + 4;
        lVar39 = lVar39 + 4;
        lVar41 = lVar41 + 4;
      }
      for (; (long)uVar25 < lVar36; uVar25 = uVar25 + 1) {
        pvVar15 = (void *)(bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 +
                          (long)bottom_im2col->data);
        iVar27 = iVar20;
        while (bVar43 = iVar27 != 0, iVar27 = iVar27 + -1, bVar43) {
          *puVar34 = *(undefined1 *)((long)pvVar15 + uVar21);
          puVar34[1] = *(undefined1 *)((long)pvVar15 + uVar21 + 1);
          puVar34 = puVar34 + 2;
          pvVar15 = (void *)((long)pvVar15 + uVar31);
        }
      }
      uVar21 = uVar21 + 2;
    }
    for (uVar21 = uVar31 & 0xfffffffffffffffe; (long)uVar21 < (long)uVar31; uVar21 = uVar21 + 1) {
      uVar24 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
      puVar34 = (undefined1 *)
                ((long)((int)((long)uVar24 % 2) + (int)((long)uVar24 / 2)) * local_48 *
                 local_88._16_8_ + local_88._0_8_);
      lVar41 = 1;
      lVar39 = 2;
      lVar23 = 3;
      for (uVar24 = 0; (long)(uVar24 | 3) < lVar36; uVar24 = uVar24 + 4) {
        lVar14 = bottom_im2col->cstep * bottom_im2col->elemsize;
        lVar32 = (long)bottom_im2col->data + uVar21;
        iVar27 = iVar20;
        while (bVar43 = iVar27 != 0, iVar27 = iVar27 + -1, bVar43) {
          *puVar34 = *(undefined1 *)(lVar32 + lVar14 * uVar24);
          puVar34[1] = *(undefined1 *)(lVar32 + lVar14 * lVar41);
          puVar34[2] = *(undefined1 *)(lVar32 + lVar14 * lVar39);
          puVar34[3] = *(undefined1 *)(lVar32 + lVar14 * lVar23);
          puVar34 = puVar34 + 4;
          lVar32 = lVar32 + uVar31;
        }
        lVar23 = lVar23 + 4;
        lVar39 = lVar39 + 4;
        lVar41 = lVar41 + 4;
      }
      for (; (long)uVar24 < lVar36; uVar24 = uVar24 + 1) {
        puVar28 = (undefined1 *)
                  ((long)bottom_im2col->data +
                  uVar21 + bottom_im2col->cstep * uVar24 * bottom_im2col->elemsize);
        iVar27 = iVar20;
        while (bVar43 = iVar27 != 0, iVar27 = iVar27 + -1, bVar43) {
          *puVar34 = *puVar28;
          puVar34 = puVar34 + 1;
          puVar28 = puVar28 + uVar31;
        }
      }
    }
    pvVar15 = top_blob->data;
    lVar36 = top_blob->cstep * top_blob->elemsize;
    uVar18 = ((int)uVar19 / 4) * iVar13;
    iVar13 = ((int)uVar19 % 4) * iVar13;
    uVar21 = 0;
    if (iVar13 < 1) {
      iVar13 = 0;
    }
    uVar24 = (ulong)(uint)(iVar3 >> 2);
    if (iVar3 >> 2 < 1) {
      uVar24 = uVar21;
    }
    for (; uVar21 != uVar24; uVar21 = uVar21 + 1) {
      puVar33 = (undefined4 *)(uVar21 * 4 * lVar36 + (long)pvVar15);
      puVar35 = (undefined4 *)((uVar21 * 4 + 1) * lVar36 + (long)pvVar15);
      puVar42 = (undefined4 *)((uVar21 * 4 + 2) * lVar36 + (long)pvVar15);
      puVar37 = (undefined4 *)((uVar21 * 4 + 3) * lVar36 + (long)pvVar15);
      pauVar26 = (undefined1 (*) [16])
                 (kernel->cstep * uVar21 * kernel->elemsize + (long)kernel->data);
      for (uVar16 = 0; (long)(uVar16 | 1) < (long)uVar31; uVar16 = uVar16 + 2) {
        puVar40 = (ulong *)((uVar16 >> 1) * local_48 * local_88._16_8_ + local_88._0_8_);
        pauVar17 = pauVar26;
        if ((int)uVar18 < 1) {
          auVar48 = ZEXT1664((undefined1  [16])0x0);
          auVar46 = ZEXT1664((undefined1  [16])0x0);
        }
        else {
          auVar53 = ZEXT1664((undefined1  [16])0x0);
          auVar55 = ZEXT1664((undefined1  [16])0x0);
          auVar46 = ZEXT1664((undefined1  [16])0x0);
          auVar57 = ZEXT1664((undefined1  [16])0x0);
          auVar50 = ZEXT1664((undefined1  [16])0x0);
          auVar51 = ZEXT1664((undefined1  [16])0x0);
          auVar48 = ZEXT1664((undefined1  [16])0x0);
          local_b8 = (undefined1  [16])0x0;
          uVar19 = uVar18;
          while( true ) {
            bVar43 = uVar19 == 0;
            uVar19 = uVar19 - 1;
            auVar49 = auVar50._0_16_;
            auVar45 = auVar51._0_16_;
            auVar56 = auVar57._0_16_;
            auVar44 = auVar46._0_16_;
            auVar47 = auVar48._0_16_;
            auVar52 = auVar53._0_16_;
            auVar54 = auVar55._0_16_;
            if (bVar43) break;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *puVar40;
            auVar6 = vpmovsxbw_avx(auVar1);
            auVar1 = *pauVar17;
            auVar5 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar12 = vpunpcklbw_avx(auVar1,auVar5);
            auVar11 = vpunpckhbw_avx(auVar1,auVar5);
            auVar5 = vpshufd_avx(auVar6,0x44);
            auVar7 = vpmullw_avx(auVar5,auVar12);
            auVar1 = vpmulhw_avx(auVar5,auVar12);
            auVar8 = vpmullw_avx(auVar5,auVar11);
            auVar5 = vpmulhw_avx(auVar5,auVar11);
            auVar10 = vpshufd_avx(auVar6,0xee);
            auVar9 = vpmullw_avx(auVar10,auVar12);
            auVar6 = vpmulhw_avx(auVar10,auVar12);
            auVar12 = vpmullw_avx(auVar10,auVar11);
            auVar10 = vpmulhw_avx(auVar10,auVar11);
            auVar11 = vpunpcklwd_avx(auVar7,auVar1);
            local_b8 = vpaddd_avx(auVar11,local_b8);
            auVar1 = vpunpckhwd_avx(auVar7,auVar1);
            auVar45 = vpaddd_avx(auVar45,auVar1);
            auVar51 = ZEXT1664(auVar45);
            auVar45 = vpunpcklwd_avx(auVar8,auVar5);
            auVar49 = vpaddd_avx(auVar45,auVar49);
            auVar50 = ZEXT1664(auVar49);
            auVar49 = vpunpckhwd_avx(auVar8,auVar5);
            auVar49 = vpaddd_avx(auVar56,auVar49);
            auVar57 = ZEXT1664(auVar49);
            auVar49 = vpunpcklwd_avx(auVar9,auVar6);
            auVar47 = vpaddd_avx(auVar49,auVar47);
            auVar48 = ZEXT1664(auVar47);
            auVar47 = vpunpckhwd_avx(auVar9,auVar6);
            auVar44 = vpaddd_avx(auVar44,auVar47);
            auVar46 = ZEXT1664(auVar44);
            auVar44 = vpunpcklwd_avx(auVar12,auVar10);
            auVar44 = vpaddd_avx(auVar54,auVar44);
            auVar55 = ZEXT1664(auVar44);
            auVar44 = vpunpckhwd_avx(auVar12,auVar10);
            auVar44 = vpaddd_avx(auVar52,auVar44);
            auVar53 = ZEXT1664(auVar44);
            puVar40 = puVar40 + 1;
            pauVar17 = pauVar17 + 1;
          }
          auVar1 = vpunpckldq_avx(local_b8,auVar45);
          auVar5 = vpunpckldq_avx(auVar49,auVar56);
          auVar45 = vpunpckhdq_avx(local_b8,auVar45);
          auVar49 = vpunpckhdq_avx(auVar49,auVar56);
          auVar6 = vpunpckldq_avx(auVar47,auVar44);
          auVar10 = vpunpckldq_avx(auVar54,auVar52);
          auVar56 = vpunpckhdq_avx(auVar47,auVar44);
          auVar52 = vpunpckhdq_avx(auVar54,auVar52);
          auVar47 = vpunpcklqdq_avx(auVar1,auVar5);
          auVar44 = vpunpckhqdq_avx(auVar1,auVar5);
          auVar44 = vpaddd_avx(auVar47,auVar44);
          auVar54 = vpunpcklqdq_avx(auVar45,auVar49);
          auVar47 = vpunpckhqdq_avx(auVar45,auVar49);
          auVar47 = vpaddd_avx(auVar47,auVar54);
          auVar44 = vpaddd_avx(auVar44,auVar47);
          auVar46 = ZEXT1664(auVar44);
          auVar47 = vpunpcklqdq_avx(auVar6,auVar10);
          auVar44 = vpunpckhqdq_avx(auVar6,auVar10);
          auVar44 = vpaddd_avx(auVar47,auVar44);
          auVar49 = vpunpcklqdq_avx(auVar56,auVar52);
          auVar47 = vpunpckhqdq_avx(auVar56,auVar52);
          auVar47 = vpaddd_avx(auVar47,auVar49);
          auVar44 = vpaddd_avx(auVar44,auVar47);
          auVar48 = ZEXT1664(auVar44);
        }
        lVar41 = 0;
        while( true ) {
          if (iVar13 == (int)lVar41) break;
          auVar44 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar40 + lVar41 * 2)));
          auVar44 = vpshuflw_avx(auVar44,0x50);
          auVar47 = vpshufd_avx(auVar44,0x50);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(*pauVar17 + lVar41 * 4);
          auVar44 = vpmovsxbw_avx(auVar44);
          auVar44 = vpshufd_avx(auVar44,0x44);
          auVar49 = vpmullw_avx(auVar47,auVar44);
          auVar47 = vpmulhw_avx(auVar47,auVar44);
          auVar44 = vpunpcklwd_avx(auVar49,auVar47);
          auVar44 = vpaddd_avx(auVar46._0_16_,auVar44);
          auVar46 = ZEXT1664(auVar44);
          auVar44 = vpunpckhwd_avx(auVar49,auVar47);
          auVar44 = vpaddd_avx(auVar48._0_16_,auVar44);
          auVar48 = ZEXT1664(auVar44);
          lVar41 = lVar41 + 1;
        }
        *puVar33 = auVar46._0_4_;
        *puVar35 = auVar46._4_4_;
        *puVar42 = auVar46._8_4_;
        *puVar37 = auVar46._12_4_;
        puVar33[1] = auVar48._0_4_;
        puVar35[1] = auVar48._4_4_;
        puVar42[1] = auVar48._8_4_;
        puVar37[1] = auVar48._12_4_;
        puVar33 = puVar33 + 2;
        puVar35 = puVar35 + 2;
        puVar42 = puVar42 + 2;
        puVar37 = puVar37 + 2;
      }
      pauVar26 = (undefined1 (*) [16])
                 (kernel->cstep * uVar21 * kernel->elemsize + (long)kernel->data);
      while (uVar19 = (uint)uVar16, (int)uVar19 < (int)uVar2) {
        puVar40 = (ulong *)((ulong)((uVar19 & 1) + ((uint)(uVar16 >> 1) & 0x7fffffff)) *
                            local_48 * local_88._16_8_ + local_88._0_8_);
        auVar46 = ZEXT1664((undefined1  [16])0x0);
        pauVar17 = pauVar26;
        if (0 < (int)uVar18) {
          auVar48 = ZEXT1664((undefined1  [16])0x0);
          auVar50 = ZEXT1664((undefined1  [16])0x0);
          auVar51 = ZEXT1664((undefined1  [16])0x0);
          uVar22 = uVar18;
          while( true ) {
            bVar43 = uVar22 == 0;
            uVar22 = uVar22 - 1;
            auVar44 = auVar46._0_16_;
            auVar47 = auVar48._0_16_;
            auVar49 = auVar50._0_16_;
            auVar45 = auVar51._0_16_;
            if (bVar43) break;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = *puVar40;
            auVar56 = vpmovsxbw_avx(auVar52);
            auVar52 = *pauVar17;
            auVar54 = vpcmpgtb_avx((undefined1  [16])0x0,auVar52);
            auVar1 = vpunpcklbw_avx(auVar52,auVar54);
            auVar5 = vpunpckhbw_avx(auVar52,auVar54);
            auVar54 = vpshufd_avx(auVar56,0x44);
            auVar56 = vpmullw_avx(auVar54,auVar1);
            auVar52 = vpmulhw_avx(auVar54,auVar1);
            auVar1 = vpmullw_avx(auVar54,auVar5);
            auVar54 = vpmulhw_avx(auVar54,auVar5);
            auVar5 = vpunpcklwd_avx(auVar56,auVar52);
            auVar44 = vpaddd_avx(auVar44,auVar5);
            auVar46 = ZEXT1664(auVar44);
            auVar44 = vpunpckhwd_avx(auVar56,auVar52);
            auVar44 = vpaddd_avx(auVar47,auVar44);
            auVar48 = ZEXT1664(auVar44);
            auVar44 = vpunpcklwd_avx(auVar1,auVar54);
            auVar44 = vpaddd_avx(auVar49,auVar44);
            auVar50 = ZEXT1664(auVar44);
            auVar44 = vpunpckhwd_avx(auVar1,auVar54);
            auVar44 = vpaddd_avx(auVar45,auVar44);
            auVar51 = ZEXT1664(auVar44);
            puVar40 = (ulong *)((long)puVar40 + 4);
            pauVar17 = pauVar17 + 1;
          }
          auVar52 = vpunpckldq_avx(auVar44,auVar47);
          auVar54 = vpunpckldq_avx(auVar49,auVar45);
          auVar47 = vpunpckhdq_avx(auVar44,auVar47);
          auVar49 = vpunpckhdq_avx(auVar49,auVar45);
          auVar45 = vpunpcklqdq_avx(auVar52,auVar54);
          auVar44 = vpunpckhqdq_avx(auVar52,auVar54);
          auVar44 = vpaddd_avx(auVar45,auVar44);
          auVar45 = vpunpcklqdq_avx(auVar47,auVar49);
          auVar47 = vpunpckhqdq_avx(auVar47,auVar49);
          auVar47 = vpaddd_avx(auVar47,auVar45);
          auVar44 = vpaddd_avx(auVar44,auVar47);
          auVar46 = ZEXT1664(auVar44);
        }
        for (lVar41 = 0; iVar13 != (int)lVar41; lVar41 = lVar41 + 1) {
          auVar44 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar40 + lVar41)),0);
          auVar49 = vpshufd_avx(auVar44,0);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)(*pauVar17 + lVar41 * 4);
          auVar44 = vpmovsxbw_avx(auVar47);
          auVar47 = vpmullw_avx(auVar49,auVar44);
          auVar44 = vpmulhw_avx(auVar49,auVar44);
          auVar44 = vpunpcklwd_avx(auVar47,auVar44);
          auVar44 = vpaddd_avx(auVar46._0_16_,auVar44);
          auVar46 = ZEXT1664(auVar44);
        }
        *puVar33 = auVar46._0_4_;
        *puVar35 = auVar46._4_4_;
        *puVar42 = auVar46._8_4_;
        *puVar37 = auVar46._12_4_;
        puVar33 = puVar33 + 1;
        puVar35 = puVar35 + 1;
        puVar42 = puVar42 + 1;
        puVar37 = puVar37 + 1;
        uVar16 = (ulong)(uVar19 + 1);
      }
    }
    sVar30 = top_blob->cstep;
    sVar4 = top_blob->elemsize;
    local_38 = top_blob->data;
    for (uVar21 = (long)iVar3 & 0xfffffffffffffffc; (long)uVar21 < (long)iVar3; uVar21 = uVar21 + 1)
    {
      uVar24 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
      piVar38 = (int *)(sVar30 * sVar4 * uVar21 + (long)local_38);
      lVar36 = (long)((int)((long)uVar24 % 4) + (int)((long)uVar24 / 4));
      pvVar15 = (void *)(kernel->cstep * lVar36 * kernel->elemsize + (long)kernel->data);
      for (uVar24 = 0; (long)(uVar24 | 1) < (long)uVar31; uVar24 = uVar24 + 2) {
        puVar40 = (ulong *)((uVar24 >> 1) * local_48 * local_88._16_8_ + local_88._0_8_);
        if ((int)uVar18 < 1) {
          iVar20 = 0;
          iVar27 = 0;
          pvVar29 = pvVar15;
        }
        else {
          auVar46 = ZEXT1664((undefined1  [16])0x0);
          lVar41 = 0;
          auVar48 = ZEXT1664((undefined1  [16])0x0);
          while( true ) {
            auVar44 = auVar46._0_16_;
            auVar47 = auVar48._0_16_;
            if (uVar18 == (uint)lVar41) break;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = *puVar40;
            auVar49 = vpcmpgtb_avx((undefined1  [16])0x0,auVar45);
            auVar52 = vpunpcklbw_avx(auVar45,auVar49);
            auVar49._8_8_ = 0;
            auVar49._0_8_ = *(ulong *)((long)pvVar15 + lVar41 * 4);
            auVar49 = vpmovsxbw_avx(auVar49);
            auVar49 = vpshufd_avx(auVar49,0x44);
            auVar45 = vpmullw_avx(auVar49,auVar52);
            auVar49 = vpmulhw_avx(auVar52,auVar49);
            auVar52 = vpunpcklwd_avx(auVar45,auVar49);
            auVar44 = vpaddd_avx(auVar44,auVar52);
            auVar46 = ZEXT1664(auVar44);
            auVar44 = vpunpckhwd_avx(auVar45,auVar49);
            auVar44 = vpaddd_avx(auVar47,auVar44);
            auVar48 = ZEXT1664(auVar44);
            puVar40 = puVar40 + 1;
            lVar41 = lVar41 + 1;
          }
          auVar44 = vphaddd_avx(auVar44,auVar44);
          auVar44 = vphaddd_avx(auVar44,auVar44);
          auVar47 = vphaddd_avx(auVar47,auVar47);
          auVar47 = vphaddd_avx(auVar47,auVar47);
          iVar20 = auVar44._0_4_;
          iVar27 = auVar47._0_4_;
          pvVar29 = (void *)((ulong)uVar18 * 4 + (long)pvVar15);
        }
        for (lVar41 = 0; iVar13 != (int)lVar41; lVar41 = lVar41 + 1) {
          iVar20 = iVar20 + (int)*(char *)((long)puVar40 + lVar41 * 2) *
                            (int)*(char *)((long)pvVar29 + lVar41);
          iVar27 = iVar27 + (int)*(char *)((long)puVar40 + lVar41 * 2 + 1) *
                            (int)*(char *)((long)pvVar29 + lVar41);
        }
        *piVar38 = iVar20;
        piVar38[1] = iVar27;
        piVar38 = piVar38 + 2;
      }
      pvVar15 = (void *)(lVar36 * kernel->cstep * kernel->elemsize + (long)kernel->data);
      while (uVar19 = (uint)uVar24, (int)uVar19 < (int)uVar2) {
        puVar40 = (ulong *)((ulong)((uVar19 & 1) + ((uint)(uVar24 >> 1) & 0x7fffffff)) *
                            local_48 * local_88._16_8_ + local_88._0_8_);
        if ((int)uVar18 < 1) {
          iVar20 = 0;
          pvVar29 = pvVar15;
        }
        else {
          auVar46 = ZEXT1664((undefined1  [16])0x0);
          for (lVar36 = 0; auVar44 = auVar46._0_16_, uVar18 != (uint)lVar36; lVar36 = lVar36 + 1) {
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *puVar40;
            auVar47 = vpmovsxbw_avx(auVar54);
            auVar56._8_8_ = 0;
            auVar56._0_8_ = *(ulong *)((long)pvVar15 + lVar36 * 4);
            auVar49 = vpmovsxbw_avx(auVar56);
            auVar45 = vpmullw_avx(auVar49,auVar47);
            auVar47 = vpmulhw_avx(auVar47,auVar49);
            auVar47 = vpunpcklwd_avx(auVar45,auVar47);
            auVar44 = vpaddd_avx(auVar44,auVar47);
            auVar46 = ZEXT1664(auVar44);
            puVar40 = (ulong *)((long)puVar40 + 4);
          }
          auVar44 = vphaddd_avx(auVar44,auVar44);
          auVar44 = vphaddd_avx(auVar44,auVar44);
          iVar20 = auVar44._0_4_;
          pvVar29 = (void *)((long)pvVar15 + (ulong)uVar18 * 4);
        }
        for (lVar36 = 0; iVar13 != (int)lVar36; lVar36 = lVar36 + 1) {
          iVar20 = iVar20 + (int)*(char *)((long)pvVar29 + lVar36) *
                            (int)*(char *)((long)puVar40 + lVar36);
        }
        *piVar38 = iVar20;
        piVar38 = piVar38 + 1;
        uVar24 = (ulong)(uVar19 + 1);
      }
    }
    piVar38 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
    if (piVar38 != (int *)0x0) {
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 == 0) {
        if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
          free((void *)local_88._0_8_);
        }
        else {
          (*(*(_func_int ***)local_88._32_8_)[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __SSE2__
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#else // __SSE2__
    tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            signed char* tmpptr = tmp.channel(i);

            int q = 0;
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }
#endif // __SSE2__

    int nn_outch = 0;
    int remain_outch_start = 0;

#if __SSE2__
    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
                __m256i _sum21_33 = _mm256_setzero_si256();
                __m256i _sum31_23 = _mm256_setzero_si256();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                    __m256i _sl20_31 = _mm256_mullo_epi16(_val23_16, _w01_16);
                    __m256i _sh20_31 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                    __m256i _sl30_21 = _mm256_mullo_epi16(_val32_16, _w01_16);
                    __m256i _sh30_21 = _mm256_mulhi_epi16(_val32_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_unpacklo_epi16(_sl20_31, _sh20_31));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_unpacklo_epi16(_sl30_21, _sh30_21));
                    _sum21_33 = _mm256_add_epi32(_sum21_33, _mm256_unpackhi_epi16(_sl20_31, _sh20_31));
                    _sum31_23 = _mm256_add_epi32(_sum31_23, _mm256_unpackhi_epi16(_sl30_21, _sh30_21));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum20_32, _sum30_22);
                    _tmp1 = _mm256_unpacklo_epi32(_sum21_33, _sum31_23);
                    _tmp2 = _mm256_unpackhi_epi32(_sum20_32, _sum30_22);
                    _tmp3 = _mm256_unpackhi_epi32(_sum21_33, _sum31_23);
                    _sum20_32 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum30_22 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum21_33 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum31_23 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum30_22);
                _sum21_33 = _mm256_add_epi32(_sum21_33, _sum31_23);
                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum21_33);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
                _sum20_32 = _mm256_permutevar8x32_epi32(_sum20_32, _perm_mask);
#endif
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val0123 = _mm_cvtepi8_epi16(_val0123);
#else
                __m128i _extval0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                _val0123 = _mm_unpacklo_epi8(_val0123, _extval0123);
#endif

                __m128i _val01 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(1, 1, 0, 0));

                _val01 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _val23 = _mm_shufflelo_epi16(_val0123, _MM_SHUFFLE(3, 3, 2, 2));

                _val23 = _mm_shuffle_epi32(_val23, _MM_SHUFFLE(1, 1, 0, 0));

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum10);
                _tmp1 = _mm_unpacklo_epi32(_sum20, _sum30);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum10);
                _tmp3 = _mm_unpackhi_epi32(_sum20, _sum30);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum10 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum20 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum30 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)outptr1, _sum10);
            _mm_storeu_si128((__m128i*)outptr2, _sum20);
            _mm_storeu_si128((__m128i*)outptr3, _sum30);
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
#endif
#else
#if __XOP__
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum02 = _mm_setzero_si128();
                __m128i _sum03 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
                __m128i _sum12 = _mm_setzero_si128();
                __m128i _sum13 = _mm_setzero_si128();
#endif
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                    __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                    __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                    __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                    __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);

                    _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl01, _sh01));
                    _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                    _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl10, _sh10));
                    _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl11, _sh11));
                    _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl11, _sh11));
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
#endif
#else
#if __XOP__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                    _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                    _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                    _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                    _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                    _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                    _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                    _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                    _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum02 = _mm_add_epi32(_sum02, _sum03);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
                _sum12 = _mm_add_epi32(_sum12, _sum13);

                _sum00 = _mm_add_epi32(_sum00, _sum02);
                _sum10 = _mm_add_epi32(_sum10, _sum12);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=99754
                // gcc incorrectly put 32bit to tail with _mm_loadu_si32  :(
                // 0 1 2 3 x x x x x x x x x x x x
                // x x x x x x x x x x x x 0 1 2 3
                // __m128i _w0123 = _mm_loadu_si32(kptr0);
                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __SSE2__
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;
            int sum2 = 0;
            int sum3 = 0;

            if (nn4 > 0)
            {
                __m256i _sum0_2 = _mm256_setzero_si256();
                __m256i _sum1_3 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
                    _w = _mm_unpacklo_epi64(_w, _w);
                    __m256i _ww = _mm256_inserti128_si256(_mm256_castsi128_si256(_w), _w, 1);

                    __m256i _sl0_1 = _mm256_mullo_epi16(_val01_16, _ww);
                    __m256i _sh0_1 = _mm256_mulhi_epi16(_val01_16, _ww);

                    _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                    _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));

                    tmpptr += 16;
                    kptr0 += 4;
                }

                __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
                __m128i _sum1 = _mm256_extracti128_si256(_sum1_3, 0);
                __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
                __m128i _sum3 = _mm256_extracti128_si256(_sum1_3, 1);

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
                sum2 = _mm_reduce_add_epi32(_sum2);
                sum3 = _mm_reduce_add_epi32(_sum3);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char val2 = tmpptr[2];
                signed char val3 = tmpptr[3];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;
                sum2 += val2 * w;
                sum3 += val3 * w;

                tmpptr += 4;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0[2] = sum2;
            outptr0[3] = sum3;
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum0 = 0;
            int sum1 = 0;

            if (nn4 > 0)
            {
                __m128i _sum0 = _mm_setzero_si128();
                __m128i _sum1 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val);
                    __m128i _val01 = _mm_unpacklo_epi8(_val, _extval);

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif
                    _w = _mm_shuffle_epi32(_w, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _sl01 = _mm_mullo_epi16(_val01, _w);
                    __m128i _sh01 = _mm_mulhi_epi16(_val01, _w);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 8;
                    kptr0 += 4;
                }

                sum0 = _mm_reduce_add_epi32(_sum0);
                sum1 = _mm_reduce_add_epi32(_sum1);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val0 = tmpptr[0];
                signed char val1 = tmpptr[1];
                signed char w = kptr0[0];

                sum0 += val0 * w;
                sum1 += val1 * w;

                tmpptr += 2;
                kptr0 += 1;
            }

            outptr0[0] = sum0;
            outptr0[1] = sum1;
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            int sum = 0;

            if (nn4 > 0)
            {
                __m128i _sum = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val = _mm_cvtepi8_epi16(_val0123);
#else
                    __m128i _extval = _mm_cmpgt_epi8(_mm_setzero_si128(), _val0123);
                    __m128i _val = _mm_unpacklo_epi8(_val0123, _extval);
#endif

                    __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                    __m128i _w = _mm_cvtepi8_epi16(_w0123);
#else
                    __m128i _extw = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                    __m128i _w = _mm_unpacklo_epi8(_w0123, _extw);
#endif

                    __m128i _sl = _mm_mullo_epi16(_val, _w);
                    __m128i _sh = _mm_mulhi_epi16(_val, _w);

                    _sum = _mm_add_epi32(_sum, _mm_unpacklo_epi16(_sl, _sh));

                    tmpptr += 4;
                    kptr0 += 4;
                }

                sum = _mm_reduce_add_epi32(_sum);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#else  // __SSE2__
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i);
            const signed char* kptr0 = kernel.channel(p);

            int nn1 = inch * maxk;

            int sum = 0;
            int j = 0;
            for (; j < nn1; j++)
            {
                signed char val = tmpptr[0];
                signed char w = kptr0[0];

                sum += val * w;

                tmpptr += 1;
                kptr0 += 1;
            }

            outptr0[0] = sum;
            outptr0 += 1;
        }
#endif // __SSE2__
    }
}